

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> __thiscall
amrex::get_slice_data
          (amrex *this,int dir,Real coord,MultiFab *cc,Geometry *geom,int start_comp,int ncomp,
          bool interpolate)

{
  Real *pRVar1;
  Box *pBVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  BaseFab<double> *this_00;
  double *pdVar10;
  undefined1 auVar11 [12];
  Real RVar12;
  Real RVar13;
  Real RVar14;
  Array4<double> slice;
  double dVar15;
  double dVar16;
  pointer ppVar17;
  FabArrayBase *fabarray_;
  long lVar18;
  BaseFab<double> *src;
  long lVar19;
  long lVar20;
  pointer __x;
  long lVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  undefined8 uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double local_368;
  double dStack_360;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  Vector<int,_std::allocator<int>_> slice_to_full_ba_map;
  DistributionMapping slice_dmap;
  RealBox real_slice;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> boxes;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_1fc;
  Vector<int,_std::allocator<int>_> procs;
  BoxArray slice_ba;
  Box thread_box;
  double dStack_140;
  BoxArray ba;
  Box lhs;
  GeometryData geomdata;
  
  Geometry::data(geom);
  slice_to_full_ba_map.super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  slice_to_full_ba_map.super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  slice_to_full_ba_map.super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  real_slice.xlo[0] = (geom->prob_domain).xlo[0];
  RVar12 = (geom->prob_domain).xlo[1];
  RVar13 = (geom->prob_domain).xlo[2];
  RVar14 = (geom->prob_domain).xhi[0];
  real_slice.xhi[1] = (geom->prob_domain).xhi[1];
  real_slice.xhi[2] = (geom->prob_domain).xhi[2];
  real_slice.xlo[2]._0_4_ = SUB84(RVar13,0);
  real_slice.xlo[2]._4_4_ = (int)((ulong)RVar13 >> 0x20);
  real_slice.xhi[0]._0_4_ = SUB84(RVar14,0);
  real_slice.xhi[0]._4_4_ = (undefined4)((ulong)RVar14 >> 0x20);
  real_slice.xlo[1]._0_4_ = SUB84(RVar12,0);
  real_slice.xlo[1]._4_4_ = (int)((ulong)RVar12 >> 0x20);
  real_slice.xlo[dir] = coord;
  RVar13 = real_slice.xlo[0];
  real_slice.xhi[dir] = coord;
  pRVar1 = (geom->super_CoordSys).dx;
  RVar12 = *pRVar1;
  auVar33 = *(undefined1 (*) [16])((geom->super_CoordSys).dx + 1);
  auVar11 = *(undefined1 (*) [12])pRVar1;
  dVar28 = (geom->prob_domain).xlo[0];
  dVar26 = (geom->prob_domain).xlo[1];
  dVar27 = (geom->prob_domain).xlo[2];
  dVar29 = (double)CONCAT44(real_slice.xlo[1]._4_4_,real_slice.xlo[1]._0_4_);
  dVar15 = (double)CONCAT44(real_slice.xlo[2]._4_4_,real_slice.xlo[2]._0_4_);
  dVar16 = (double)CONCAT44(real_slice.xhi[0]._4_4_,real_slice.xhi[0]._0_4_);
  auVar30._0_8_ = real_slice.xhi[1] - dVar26;
  auVar30._8_8_ = real_slice.xhi[2] - dVar27;
  auVar31 = divpd(auVar30,auVar33);
  dVar23 = floor(auVar31._0_8_);
  dStack_140 = auVar31._8_8_;
  dVar24 = floor(dStack_140);
  uVar25._0_4_ = (int)dVar23;
  uVar25._4_4_ = (int)dVar24;
  auVar32._0_8_ = RVar13 - dVar28;
  auVar32._8_8_ = dVar29 - dVar26;
  auVar34._0_8_ = dVar15 - dVar27;
  auVar34._8_8_ = dVar16 - dVar28;
  auVar31._12_4_ = auVar33._4_4_;
  auVar31._0_12_ = auVar11;
  auVar31 = divpd(auVar32,auVar31);
  auVar35._8_8_ = RVar12;
  auVar35._0_8_ = auVar33._8_8_;
  auVar35 = divpd(auVar34,auVar35);
  dVar26 = floor(auVar31._0_8_);
  uStack_354 = auVar31._4_4_;
  uStack_350 = auVar31._8_4_;
  uStack_34c = auVar31._12_4_;
  auVar11._4_8_ = extraout_XMM0_Qb;
  auVar11._0_4_ = uStack_354;
  auVar33._0_8_ = auVar11._0_8_ << 0x20;
  auVar33._8_4_ = uStack_350;
  auVar33._12_4_ = uStack_34c;
  dVar27 = floor(auVar33._8_8_);
  local_368 = auVar35._0_8_;
  dVar28 = floor(local_368);
  dStack_360 = auVar35._8_8_;
  dVar29 = floor(dStack_360);
  lhs.smallend.vect[2] = (int)dVar28;
  lhs.bigend.vect[0] = (int)dVar29;
  lhs.smallend.vect[0] = (int)dVar26;
  lhs.smallend.vect[1] = (int)dVar27;
  lhs.btype.itype = 0;
  lhs.bigend.vect._4_8_ = uVar25;
  Box::operator&=(&lhs,&geom->domain);
  BoxArray::BoxArray(&ba,&(cc->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BoxArray::intersections(&ba,&lhs,&isects,false,0);
  ppVar17 = isects.
            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  procs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  procs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  procs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (__x = isects.
             super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != ppVar17; __x = __x + 1) {
    slice_ba.m_bat.m_bat_type =
         *(BATType *)
          (*(long *)&(((cc->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.
                       m_ref.
                       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + (long)__x->first * 4);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&procs.super_vector<int,_std::allocator<int>_>,(int *)&slice_ba);
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
              (&boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>,&__x->second);
    std::vector<int,_std::allocator<int>_>::push_back
              (&slice_to_full_ba_map.super_vector<int,_std::allocator<int>_>,&__x->first);
  }
  BoxArray::BoxArray(&slice_ba,
                     boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (int)(((long)boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start) / 0x1c));
  DistributionMapping::DistributionMapping(&slice_dmap,&procs);
  fabarray_ = (FabArrayBase *)operator_new(0x180);
  thread_box.smallend.vect[0] = 1;
  thread_box.smallend.vect[1] = 0;
  thread_box.smallend.vect[2] = 0;
  thread_box.bigend.vect[0] = 0;
  thread_box.bigend.vect[1] = 0;
  thread_box.bigend.vect[2] = 0;
  thread_box.btype.itype = 0;
  MultiFab::MultiFab((MultiFab *)fabarray_,&slice_ba,&slice_dmap,ncomp,0,(MFInfo *)&thread_box,
                     (cc->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  *(FabArrayBase **)this = fabarray_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(thread_box.bigend.vect + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&slice_dmap.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BoxArray::~BoxArray(&slice_ba);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&procs);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&boxes);
  std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
  ~_Vector_base(&isects.
                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               );
  BoxArray::~BoxArray(&ba);
  MFIter::MFIter((MFIter *)&ba,fabarray_,true);
  while (lVar18 = (long)ba.m_bat.m_op.m_bndryReg.m_loshft.vect[2],
        ba.m_bat.m_op.m_bndryReg.m_loshft.vect[2] < ba.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) {
    lVar19 = lVar18;
    if (ba.m_bat.m_op._60_8_ != 0) {
      lVar19 = (long)*(int *)(*(long *)ba.m_bat.m_op._60_8_ + lVar18 * 4);
    }
    this_00 = *(BaseFab<double> **)
               (*(long *)((long)&fabarray_[1].boxarray.m_bat.m_op + 0xc) + lVar19 * 8);
    src = &FabArray<amrex::FArrayBox>::fabPtr
                     (&cc->super_FabArray<amrex::FArrayBox>,
                      slice_to_full_ba_map.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[*(int *)(*(long *)ba.m_bat.m_op._52_8_ + lVar18 * 4)])->
           super_BaseFab<double>;
    pdVar10 = this_00->dptr;
    iVar3 = this_00->nvar;
    pBVar2 = &this_00->domain;
    iVar4 = (pBVar2->smallend).vect[0];
    iVar5 = (this_00->domain).smallend.vect[1];
    iVar6 = (this_00->domain).smallend.vect[2];
    iVar7 = (this_00->domain).bigend.vect[0];
    iVar8 = (this_00->domain).bigend.vect[1];
    iVar9 = (this_00->domain).bigend.vect[2];
    slice_ba.m_bat._0_8_ = src->dptr;
    slice_ba.m_bat.m_op.m_bndryReg.m_doilo.vect[2] = src->nvar;
    slice_ba.m_bat.m_op.m_bndryReg.m_hishft.vect[1] = (src->domain).smallend.vect[2];
    slice_ba.m_bat.m_op._28_8_ = *(undefined8 *)(src->domain).smallend.vect;
    lVar19 = (long)(src->domain).bigend.vect[0];
    lVar20 = (long)(src->domain).bigend.vect[1] + 1;
    slice_ba.m_bat.m_op._4_8_ = (lVar19 - (src->domain).smallend.vect[0]) + 1;
    slice_ba.m_bat.m_op._12_8_ =
         (lVar20 - (src->domain).smallend.vect[1]) * slice_ba.m_bat.m_op._4_8_;
    lVar18 = (long)(src->domain).bigend.vect[2] + 1;
    slice_ba.m_bat.m_op._20_8_ =
         (lVar18 - slice_ba.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) * slice_ba.m_bat.m_op._12_8_;
    slice_ba.m_bat.m_op._40_8_ = lVar19 + 1U & 0xffffffff | lVar20 << 0x20;
    slice_ba.m_bat.m_op.m_bndryReg.m_doilo.vect[1] = (int)lVar18;
    MFIter::tilebox((Box *)&real_slice,(MFIter *)&ba);
    if (interpolate) {
      lVar20 = (long)iVar8 + 1;
      lVar18 = (long)iVar7 + 1;
      lVar19 = lVar18 - iVar4;
      lVar21 = (lVar20 - iVar5) * lVar19;
      lVar22 = (long)iVar9 + 1;
      thread_box.bigend.vect[1] = real_slice.xlo[2]._0_4_;
      thread_box.bigend.vect[2] = real_slice.xlo[2]._4_4_;
      thread_box.btype.itype = real_slice.xhi[0]._0_4_;
      thread_box.smallend.vect._0_8_ = real_slice.xlo[0];
      thread_box.smallend.vect[2] = real_slice.xlo[1]._0_4_;
      thread_box.bigend.vect[0] = real_slice.xlo[1]._4_4_;
      uStack_20c = (undefined4)lVar18;
      uStack_208 = (undefined4)lVar20;
      slice.end.x = uStack_20c;
      slice.begin.z = iVar6;
      slice.end.z = (int)lVar22;
      slice.end.y = uStack_208;
      slice._60_4_ = uStack_1fc;
      slice.ncomp = iVar3;
      slice.jstride = lVar19;
      slice.p = pdVar10;
      slice.kstride = lVar21;
      slice.nstride = (lVar22 - iVar6) * lVar21;
      slice.begin.x = (pBVar2->smallend).vect[0];
      slice.begin.y = (pBVar2->smallend).vect[1];
      amrex_fill_slice_interp
                (&thread_box,slice,(Array4<const_double> *)&slice_ba,0,start_comp,ncomp,dir,coord,
                 &geomdata);
    }
    else {
      BaseFab<double>::copy<(amrex::RunOn)0>
                (this_00,src,(Box *)&real_slice,start_comp,(Box *)&real_slice,0,ncomp);
    }
    MFIter::operator++((MFIter *)&ba);
  }
  MFIter::~MFIter((MFIter *)&ba);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&slice_to_full_ba_map);
  return (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
         (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)this;
}

Assistant:

std::unique_ptr<MultiFab> get_slice_data(int dir, Real coord, const MultiFab& cc, const Geometry& geom, int start_comp, int ncomp, bool interpolate) {

        BL_PROFILE("amrex::get_slice_data");

        if (interpolate) {
            AMREX_ASSERT(cc.nGrow() >= 1);
        }

        const auto geomdata = geom.data();

        Vector<int> slice_to_full_ba_map;
        std::unique_ptr<MultiFab> slice = allocateSlice(dir, cc, ncomp, geom, coord, slice_to_full_ba_map);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*slice, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            int slice_gid = mfi.index();
            int full_gid = slice_to_full_ba_map[slice_gid];
            auto& slice_fab = (*slice)[mfi];
            auto const& full_fab = cc[full_gid];
            Array4<Real> const& slice_arr = slice_fab.array();
            Array4<Real const> const& full_arr = full_fab.const_array();

            const Box& tile_box  = mfi.tilebox();

            if (interpolate)
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA( tile_box, thread_box,
                {
                    amrex_fill_slice_interp(thread_box, slice_arr, full_arr,
                                            0, start_comp, ncomp,
                                            dir, coord, geomdata);
                });
            }
            else
            {
                slice_fab.copy<RunOn::Device>(full_fab, tile_box, start_comp, tile_box, 0, ncomp);
            }
        }

        return slice;
    }